

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.h
# Opt level: O1

void __thiscall chrono::ChMinMaxDistribution::~ChMinMaxDistribution(ChMinMaxDistribution *this)

{
  operator_delete(this,0x18);
  return;
}

Assistant:

class ChApi ChMinMaxDistribution : public ChDistribution {
  public:
    ChMinMaxDistribution(double mmin, double mmax);

    /// Compute a random value whose probability is defined by the distribution,
    /// that is a value between min and max.
    virtual double GetRandom() override;

  private:
    double min;
    double max;
}